

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateNegation
          (ScalarEvolutionAnalysis *this,SENode *operand)

{
  int iVar1;
  tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_> tVar2;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  __position;
  SENode *pSVar3;
  undefined4 extraout_var;
  pointer *__ptr;
  anon_class_8_1_a7bde43c find_first_less_than;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_38;
  SENode *local_30;
  
  iVar1 = (**operand->_vptr_SENode)(operand);
  if (iVar1 == 6) {
    pSVar3 = this->cached_cant_compute_;
  }
  else {
    iVar1 = (**operand->_vptr_SENode)(operand);
    if (iVar1 == 0) {
      iVar1 = (*operand->_vptr_SENode[4])(operand);
      pSVar3 = CreateConstant(this,-*(long *)(CONCAT44(extraout_var,iVar1) + 0x30));
      return pSVar3;
    }
    tVar2.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         operator_new(0x30);
    *(long *)((long)tVar2.
                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8) = 0;
    *(long *)((long)tVar2.
                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = 0;
    *(long *)((long)tVar2.
                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = 0;
    *(ScalarEvolutionAnalysis **)
     ((long)tVar2.
            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = this;
    SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
    *(int *)((long)tVar2.
                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
         SENode::NumberOfNodes;
    *(undefined ***)
     tVar2.
     super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
     super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_003dfde0;
    local_30 = operand;
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                           (0,0,operand);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               ((long)tVar2.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8),
               (const_iterator)__position._M_current,&local_30);
    local_38._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         tVar2.
         super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
         .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
    pSVar3 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                  *)&local_38);
    if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
        local_38._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl +
                  0x10))();
    }
  }
  return pSVar3;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateNegation(SENode* operand) {
  // If operand is can't compute then the whole graph is can't compute.
  if (operand->IsCantCompute()) return CreateCantComputeNode();

  if (operand->GetType() == SENode::Constant) {
    return CreateConstant(-operand->AsSEConstantNode()->FoldToSingleValue());
  }
  std::unique_ptr<SENode> negation_node{new SENegative(this)};
  negation_node->AddChild(operand);
  return GetCachedOrAdd(std::move(negation_node));
}